

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall QFileSystemModel::setNameFilters(QFileSystemModel *this,QStringList *filters)

{
  QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *this_00;
  char16_t *pcVar1;
  QFileSystemModelPrivate *this_01;
  Data *pDVar2;
  QFileSystemModelPrivate *this_02;
  Data *pDVar3;
  char cVar4;
  Type TVar5;
  QFileSystemNode *pQVar6;
  Node<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *pNVar7;
  QModelIndex *persistentIndex;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QPersistentModelIndex root;
  QFileSystemNode *local_80;
  QString local_78;
  QPersistentModelIndex local_58;
  Data<QHashPrivate::Node<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>_> *local_50;
  ulong local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QFileSystemModelPrivate **)&this->field_0x8;
  pDVar2 = (this_01->bypassFilters).d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    this_00 = &this_01->bypassFilters;
    QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::clear(this_00);
    local_58.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::path();
    this_02 = *(QFileSystemModelPrivate **)&this->field_0x8;
    pQVar6 = QFileSystemModelPrivate::node(this_02,&local_78,false);
    QFileSystemModelPrivate::index
              ((QFileSystemModelPrivate *)&stack0xffffffffffffffb0,(char *)this_02,(int)pQVar6);
    QPersistentModelIndex::QPersistentModelIndex(&local_58,(QModelIndex *)&stack0xffffffffffffffb0);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
      pcVar1 = local_78.d.ptr + local_78.d.size * 0xc;
      pcVar8 = local_78.d.ptr;
      do {
        local_80 = &this_01->root;
        if (*(long *)(pcVar8 + 8) != 0) {
          local_80 = *(QFileSystemNode **)(pcVar8 + 4);
        }
        if ((int)(*(uint *)(pcVar8 + 2) | *(uint *)pcVar8) < 0) {
          local_80 = &this_01->root;
        }
        for (; local_80 != (QFileSystemNode *)0x0; local_80 = local_80->parent) {
          if (this_00->d != (Data *)0x0) {
            pNVar7 = QHashPrivate::
                     Data<QHashPrivate::Node<QFileSystemModelPrivate::QFileSystemNode_const*,bool>>
                     ::findNode<QFileSystemModelPrivate::QFileSystemNode_const*>
                               ((Data<QHashPrivate::Node<QFileSystemModelPrivate::QFileSystemNode_const*,bool>>
                                 *)this_00->d,&local_80);
            if (pNVar7 != (Node<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *)0x0)
            break;
          }
          if (local_80->info == (QExtendedInformation *)0x0) {
            pDVar3 = (local_80->children).d;
            if (pDVar3 != (Data *)0x0) {
              bVar9 = 0 < (long)pDVar3->size;
              goto LAB_00624188;
            }
          }
          else {
            TVar5 = QExtendedInformation::type(local_80->info);
            bVar9 = TVar5 == Dir;
LAB_00624188:
            if (bVar9) {
              QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool>::
              tryEmplace_impl<QFileSystemModelPrivate::QFileSystemNode_const*const&>
                        ((TryEmplaceResult *)&stack0xffffffffffffffb0,
                         (QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool> *)this_00,
                         &local_80);
              local_50->spans[local_48 >> 7].entries
              [local_50->spans[local_48 >> 7].offsets[(uint)local_48 & 0x7f]].storage.data[8] =
                   '\x01';
            }
          }
        }
        pcVar8 = pcVar8 + 0xc;
      } while (pcVar8 != pcVar1);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x18,0x10);
      }
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_58);
  }
  QArrayDataPointer<QString>::operator=(&(this_01->nameFilters).d,&filters->d);
  QFileSystemModelPrivate::rebuildNameFilterRegexps(this_01);
  this_01->forceSort = true;
  cVar4 = QTimer::isActive();
  if (cVar4 == '\0') {
    QTimer::start((int)this_01 + 0xe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::setNameFilters(const QStringList &filters)
{
#if QT_CONFIG(regularexpression)
    Q_D(QFileSystemModel);

    if (!d->bypassFilters.isEmpty()) {
        // update the bypass filter to only bypass the stuff that must be kept around
        d->bypassFilters.clear();
        // We guarantee that rootPath will stick around
        QPersistentModelIndex root(index(rootPath()));
        const QModelIndexList persistentList = persistentIndexList();
        for (const auto &persistentIndex : persistentList) {
            QFileSystemModelPrivate::QFileSystemNode *node = d->node(persistentIndex);
            while (node) {
                if (d->bypassFilters.contains(node))
                    break;
                if (node->isDir())
                    d->bypassFilters[node] = true;
                node = node->parent;
            }
        }
    }

    d->nameFilters = filters;
    d->rebuildNameFilterRegexps();
    d->forceSort = true;
    d->delayedSort();
#else
    Q_UNUSED(filters);
#endif
}